

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O0

ArrayRef<double> * __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::InitialDualValues
          (BasicProblem<mp::BasicProblemParams<int>_> *this)

{
  ArrayRef<double> *in_RSI;
  ArrayRef<double> *in_RDI;
  
  ArrayRef<double>::ArrayRef(in_RSI,&in_RDI->save_);
  return in_RDI;
}

Assistant:

ArrayRef<double> InitialDualValues() const { return initial_dual_values_; }